

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redirectfree.h
# Opt level: O2

void Hoard::
     RedirectFree<Hoard::LockMallocHeap<Hoard::SmallHeap>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
     ::free(void *__ptr)

{
  long *plVar1;
  ulong uVar2;
  
  uVar2 = (ulong)__ptr & 0xfffffffffffc0000;
  HL::SpinLockType::lock((SpinLockType *)(uVar2 + 0x20));
  while( true ) {
    plVar1 = *(long **)(uVar2 + 0x28);
    (**(code **)(*plVar1 + 8))(plVar1);
    if (plVar1 == *(long **)(uVar2 + 0x28)) break;
    (*(code *)((undefined8 *)*plVar1)[2])(plVar1);
    sched_yield();
  }
  (**(code **)*plVar1)(plVar1,__ptr);
  (**(code **)(*plVar1 + 0x10))(plVar1);
  LOCK();
  (((SpinLockType *)(uVar2 + 0x20))->_mutex)._M_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

static inline void free (void * ptr) {
      // Get the superblock header.
      SuperblockType * s = reinterpret_cast<SuperblockType *>(Heap::getSuperblock (ptr));

      assert (s->isValidSuperblock());

      // Find out who the owner is.

      typedef BaseHoardManager<SuperblockType> * baseHeapType;
      baseHeapType owner;

      s->lock();

      // By acquiring the lock on the superblock (above),
      // we prevent it from moving up to a higher heap.
      // This eventually pins it down in one heap,
      // so this loop is guaranteed to terminate.
      // (It should generally take no more than two iterations.)

      for (;;) {
	owner = reinterpret_cast<baseHeapType>(s->getOwner());
	assert (owner != nullptr);
	assert (owner->isValid());
	// Lock the owner. If ownership changed between these two lines,
	// we'll detect it and try again.
	owner->lock();
	if (owner == reinterpret_cast<baseHeapType>(s->getOwner())) {
	  owner->free (ptr);
	  owner->unlock();
	  s->unlock();
	  return;
	}
	owner->unlock();

	// Sleep a little.
	HL::Fred::yield();
      }
    }